

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O1

void absl::lts_20250127::internal_any_invocable::LocalManagerTrivial
               (FunctionToCall param_1,TypeErasedState *from,TypeErasedState *to)

{
  size_t sVar1;
  
  sVar1 = (from->remote).size;
  (to->remote).target = (from->remote).target;
  (to->remote).size = sVar1;
  return;
}

Assistant:

inline void LocalManagerTrivial(FunctionToCall /*operation*/,
                                TypeErasedState* const from,
                                TypeErasedState* const to) noexcept {
  // This single statement without branching handles both possible operations.
  //
  // For FunctionToCall::dispose, "from" and "to" point to the same state, and
  // so this assignment logically would do nothing.
  //
  // Note: Correctness here relies on http://wg21.link/p0593, which has only
  // become standard in C++20, though implementations do not break it in
  // practice for earlier versions of C++.
  //
  // The correct way to do this without that paper is to first placement-new a
  // default-constructed T in "to->storage" prior to the memmove, but doing so
  // requires a different function to be created for each T that is stored
  // locally, which can cause unnecessary bloat and be less cache friendly.
  *to = *from;

  // Note: Because the type is trivially copyable, the destructor does not need
  // to be called ("trivially copyable" requires a trivial destructor).
}